

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void duckdb::RollbackUpdate<bool>(UpdateInfo *base_info,UpdateInfo *rollback_info)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  uVar2 = rollback_info->N;
  if ((ulong)uVar2 != 0) {
    uVar3 = base_info->max;
    uVar4 = rollback_info->max;
    lVar6 = 0;
    uVar7 = 0;
    do {
      lVar5 = lVar6 + -1;
      do {
        lVar6 = lVar5 + 1;
        lVar1 = lVar5 * 4;
        lVar5 = lVar6;
      } while (*(uint *)((long)&base_info[1].segment + lVar1 + 4) <
               *(uint *)((long)&rollback_info[1].segment + uVar7 * 4));
      *(undefined1 *)((long)&base_info[1].segment + lVar6 + (ulong)uVar3 * 4) =
           *(undefined1 *)((long)&rollback_info[1].segment + uVar7 + (ulong)uVar4 * 4);
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar2);
  }
  return;
}

Assistant:

static void RollbackUpdate(UpdateInfo &base_info, UpdateInfo &rollback_info) {
	auto base_data = base_info.GetData<T>();
	auto base_tuples = base_info.GetTuples();
	auto rollback_data = rollback_info.GetData<T>();
	auto rollback_tuples = rollback_info.GetTuples();
	idx_t base_offset = 0;
	for (idx_t i = 0; i < rollback_info.N; i++) {
		auto id = rollback_tuples[i];
		while (base_tuples[base_offset] < id) {
			base_offset++;
			D_ASSERT(base_offset < base_info.N);
		}
		base_data[base_offset] = rollback_data[i];
	}
}